

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

CAmount __thiscall
wallet::anon_unknown_5::WalletImpl::getMinimumFee
          (WalletImpl *this,uint tx_bytes,CCoinControl *coin_control,int *returned_target,
          FeeReason *reason)

{
  CAmount CVar1;
  long in_FS_OFFSET;
  FeeCalculation local_98;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.est.pass.start = -1.0;
  local_98.est.pass.end = -1.0;
  local_98.est.pass.withinTarget = 0.0;
  local_98.est.pass.totalConfirmed = 0.0;
  local_98.est.pass.inMempool = 0.0;
  local_98.est.pass.leftMempool = 0.0;
  local_98.est.fail.start = -1.0;
  local_98.est.fail.end = -1.0;
  local_98.est.fail.withinTarget = 0.0;
  local_98.est.fail.totalConfirmed = 0.0;
  local_98.est.fail.inMempool = 0.0;
  local_98.est.fail.leftMempool._0_4_ = 0;
  local_98.est.fail.leftMempool._4_4_ = 0;
  local_98.est.decay._0_4_ = 0;
  local_98.est._100_8_ = 0;
  local_98.reason = NONE;
  local_98.desiredTarget = 0;
  local_98.returnedTarget = 0;
  CVar1 = GetMinimumFee((this->m_wallet).
                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        tx_bytes,coin_control,&local_98);
  if (returned_target != (int *)0x0) {
    *returned_target = local_98.returnedTarget;
  }
  if (reason != (FeeReason *)0x0) {
    *reason = local_98.reason;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return CVar1;
  }
  __stack_chk_fail();
}

Assistant:

CAmount getMinimumFee(unsigned int tx_bytes,
        const CCoinControl& coin_control,
        int* returned_target,
        FeeReason* reason) override
    {
        FeeCalculation fee_calc;
        CAmount result;
        result = GetMinimumFee(*m_wallet, tx_bytes, coin_control, &fee_calc);
        if (returned_target) *returned_target = fee_calc.returnedTarget;
        if (reason) *reason = fee_calc.reason;
        return result;
    }